

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTest::~ParserTest(ParserTest *this)

{
  ParserTest *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ParserTest_00265150;
  VirtualFileSystem::~VirtualFileSystem(&this->fs_);
  State::~State(&this->state);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void AssertParse(const char* input) {
    ManifestParser parser(&state, &fs_);
    string err;
    EXPECT_TRUE(parser.ParseTest(input, &err));
    ASSERT_EQ("", err);
    VerifyGraph(state);
  }